

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_integerwidth.cpp
# Opt level: O0

IntegerWidth __thiscall icu_63::number::IntegerWidth::truncateAt(IntegerWidth *this,int32_t maxInt)

{
  short minInt_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  IntegerWidth IVar1;
  digits_t minInt;
  int32_t maxInt_local;
  IntegerWidth *this_local;
  undefined1 local_c;
  
  if ((this->fHasError & 1U) == 0) {
    minInt_00 = (this->fUnion).minMaxInt.fMinInt;
    if (((maxInt < 0) || (999 < maxInt)) || (maxInt < minInt_00)) {
      if (maxInt == -1) {
        IntegerWidth((IntegerWidth *)((long)&this_local + 4),minInt_00,-1,false);
        in_RDX = extraout_RDX_00;
      }
      else {
        IntegerWidth((IntegerWidth *)((long)&this_local + 4),U_NUMBER_ARG_OUTOFBOUNDS_ERROR);
        in_RDX = extraout_RDX_01;
      }
    }
    else {
      IntegerWidth((IntegerWidth *)((long)&this_local + 4),minInt_00,(digits_t)maxInt,false);
      in_RDX = extraout_RDX;
    }
  }
  else {
    unique0x00012000 = (anon_union_8_2_136a0349_for_fUnion)(this->fUnion).field2;
    local_c = (undefined1)*(undefined4 *)&this->fHasError;
  }
  IVar1._8_4_ = (undefined4)CONCAT71((int7)((ulong)in_RDX >> 8),local_c);
  IVar1.fUnion.field2 = stack0xffffffffffffffec;
  return IVar1;
}

Assistant:

IntegerWidth IntegerWidth::truncateAt(int32_t maxInt) {
    if (fHasError) { return *this; }  // No-op on error
    digits_t minInt = fUnion.minMaxInt.fMinInt;
    if (maxInt >= 0 && maxInt <= kMaxIntFracSig && minInt <= maxInt) {
        return {minInt, static_cast<digits_t>(maxInt), false};
    } else if (maxInt == -1) {
        return {minInt, -1, false};
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}